

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeblock.cpp
# Opt level: O0

CodeBlock * __thiscall cppgenerate::CodeBlock::operator=(CodeBlock *this,CodeBlock *other)

{
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  CodeBlock *local_18;
  CodeBlock *other_local;
  CodeBlock *this_local;
  
  if (this != other) {
    this->m_indent = other->m_indent;
    local_18 = other;
    other_local = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"",&local_39);
    std::__cxx11::ostringstream::str((string *)this);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::__cxx11::ostringstream::str();
    std::operator<<((ostream *)this,local_70);
    std::__cxx11::string::~string(local_70);
  }
  return this;
}

Assistant:

CodeBlock& CodeBlock::operator=( const CodeBlock& other ){
    if( this != &other ){
        m_indent = other.m_indent;
        m_text.str( "" );
        m_text << other.m_text.str();
    }

    return *this;
}